

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

void __thiscall
GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>::Replace
          (MP<136UL,_GF2::MOGrevlex<136UL>_> *this,size_t pos,size_t posNew)

{
  size_t *psVar1;
  _List_node_base **pp_Var2;
  _List_node_base **pp_Var3;
  ulong uVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  long lVar7;
  ulong uVar8;
  
  if (pos == posNew) {
    return;
  }
  p_Var6 = (this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)this) {
    uVar8 = 1L << ((byte)pos & 0x3f);
    do {
      uVar4 = *(size_t *)((long)(p_Var6 + 1) + (pos >> 6) * 8);
      if ((uVar4 & uVar8) != 0) {
        *(ulong *)((long)(p_Var6 + 1) + (pos >> 6) * 8) = uVar4 ^ uVar8;
        psVar1 = (size_t *)((long)(p_Var6 + 1) + (posNew >> 6) * 8);
        *psVar1 = *psVar1 | 1L << ((byte)posNew & 0x3f);
      }
      p_Var6 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var6->_M_next)->
               super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var6 != (_List_node_base *)this);
    Normalize(this);
    return;
  }
  std::__cxx11::list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>>::sort<GF2::MOGrevlex<136ul>>();
  p_Var6 = (this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    p_Var5 = p_Var6;
    if ((p_Var5 == (_List_node_base *)this) ||
       (p_Var6 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var5->_M_next)->
                 super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node
                 .super__List_node_base._M_next, p_Var6 == (_List_node_base *)this)) {
      return;
    }
    lVar7 = 4;
    do {
      pp_Var2 = &p_Var5->_M_next + lVar7;
      pp_Var3 = &p_Var6->_M_next + lVar7;
      if (lVar7 == 2) break;
      lVar7 = lVar7 + -1;
    } while (*pp_Var2 == *pp_Var3);
    if (*pp_Var2 == *pp_Var3) {
      psVar1 = &(this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
                super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x28);
      p_Var5 = p_Var6->_M_next;
      psVar1 = &(this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
                super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var6,0x28);
      p_Var6 = p_Var5;
    }
  } while( true );
}

Assistant:

void Replace(size_t pos, size_t posNew)
	{	
		if (pos == posNew)
			return;
		for (iterator iter = begin(); iter != end(); ++iter)
			// переменная pos входит в моном *iter?
			if (iter->Test(pos))
				iter->Flip(pos), iter->Set(posNew, 1);
		Normalize();
	}